

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O2

char * stbi_zlib_decode_malloc_guesssize_headerflag
                 (char *buffer,int len,int initial_size,int *outlen,int parse_header)

{
  int iVar1;
  char *obuf;
  stbi__zbuf a;
  
  obuf = (char *)malloc((long)initial_size);
  if (obuf != (char *)0x0) {
    a.zbuffer_end = (stbi_uc *)(buffer + len);
    a.zbuffer = (stbi_uc *)buffer;
    iVar1 = stbi__do_zlib(&a,obuf,initial_size,1,parse_header);
    if (iVar1 != 0) {
      if (outlen == (int *)0x0) {
        return a.zout_start;
      }
      *outlen = (int)a.zout - (int)a.zout_start;
      return a.zout_start;
    }
    free(a.zout_start);
  }
  return (char *)0x0;
}

Assistant:

STBIDEF char *stbi_zlib_decode_malloc_guesssize_headerflag(const char *buffer, int len, int initial_size, int *outlen, int parse_header)
{
   stbi__zbuf a;
   char *p = (char *) stbi__malloc(initial_size);
   if (p == NULL) return NULL;
   a.zbuffer = (stbi_uc *) buffer;
   a.zbuffer_end = (stbi_uc *) buffer + len;
   if (stbi__do_zlib(&a, p, initial_size, 1, parse_header)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      STBI_FREE(a.zout_start);
      return NULL;
   }
}